

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileInstrument.cpp
# Opt level: O0

void __thiscall Js::Profiler::MergeTree(Profiler *this,TypeNode *toNode,TypeNode *fromNode)

{
  bool bVar1;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar2;
  TreeNode<Js::UnitData,_373> *this_00;
  TrackAllocData local_70;
  TreeNode<Js::UnitData,_373> *local_48;
  TypeNode *toChild;
  TypeNode *fromChild;
  UnitData *pUStack_30;
  int i;
  UnitData *fromData;
  UnitData *toData;
  TypeNode *fromNode_local;
  TypeNode *toNode_local;
  Profiler *this_local;
  
  toData = &fromNode->value;
  fromNode_local = toNode;
  toNode_local = (TypeNode *)this;
  fromData = TreeNode<Js::UnitData,_373>::GetValue(toNode);
  pUStack_30 = TreeNode<Js::UnitData,_373>::GetValue((TreeNode<Js::UnitData,_373> *)toData);
  fromData->count = pUStack_30->count + fromData->count;
  fromData->incl = pUStack_30->incl + fromData->incl;
  fromData->excl = pUStack_30->excl + fromData->excl;
  if (fromData->max < pUStack_30->max) {
    fromData->max = pUStack_30->max;
  }
  for (fromChild._4_4_ = 0; fromChild._4_4_ < 0x175; fromChild._4_4_ = fromChild._4_4_ + 1) {
    bVar1 = TreeNode<Js::UnitData,_373>::ChildExistsAt
                      ((TreeNode<Js::UnitData,_373> *)toData,fromChild._4_4_);
    if (bVar1) {
      toChild = TreeNode<Js::UnitData,_373>::GetChildAt
                          ((TreeNode<Js::UnitData,_373> *)toData,fromChild._4_4_);
      bVar1 = TreeNode<Js::UnitData,_373>::ChildExistsAt(fromNode_local,fromChild._4_4_);
      if (bVar1) {
        local_48 = TreeNode<Js::UnitData,_373>::GetChildAt(fromNode_local,fromChild._4_4_);
      }
      else {
        pAVar2 = &this->alloc->
                  super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_70,(type_info *)&TreeNode<Js::UnitData,373>::typeinfo,0,0xffffffffffffffff
                   ,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ProfileInstrument.cpp"
                   ,0x118);
        pAVar2 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 TrackAllocInfo(pAVar2,&local_70);
        this_00 = (TreeNode<Js::UnitData,_373> *)
                  new<Memory::ArenaAllocator>(0xbd0,(ArenaAllocator *)pAVar2,0x3f67b0);
        TreeNode<Js::UnitData,_373>::TreeNode(this_00,fromNode_local);
        local_48 = this_00;
        TreeNode<Js::UnitData,_373>::SetChildAt(fromNode_local,fromChild._4_4_,this_00);
      }
      MergeTree(this,local_48,toChild);
    }
  }
  return;
}

Assistant:

void
    Profiler::MergeTree(TypeNode * toNode, TypeNode * fromNode)
    {
        UnitData * toData = toNode->GetValue();
        const UnitData * fromData = fromNode->GetValue();

        toData->count += fromData->count;
        toData->incl += fromData->incl;
        toData->excl += fromData->excl;
        if (fromData->max > toData->max)
        {
            toData->max = fromData->max;
        }
        for (int i = 0; i < PhaseCount; i++)
        {
            if (fromNode->ChildExistsAt(i))
            {
                TypeNode * fromChild = fromNode->GetChildAt(i);
                TypeNode * toChild;
                if (!toNode->ChildExistsAt(i))
                {
                    toChild = Anew(this->alloc, TypeNode, toNode);
                    toNode->SetChildAt(i, toChild);
                }
                else
                {
                    toChild = toNode->GetChildAt(i);
                }
                MergeTree(toChild, fromChild);
            }
        }
    }